

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

int map_iterator_end(map_iterator *it)

{
  map_iterator __ptr;
  int iVar1;
  
  iVar1 = 0;
  if (((it != (map_iterator *)0x0) && (__ptr = *it, iVar1 = 0, __ptr != (map_iterator)0x0)) &&
     (iVar1 = 1, __ptr->m->capacity <= __ptr->current_bucket)) {
    free(__ptr);
    *it = (map_iterator)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int map_iterator_end(map_iterator *it)
{
	if (it != NULL && *it != NULL)
	{
		if ((*it)->current_bucket >= (*it)->m->capacity)
		{
			free(*it);

			*it = NULL;

			return 0;
		}

		return 1;
	}

	return 0;
}